

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.hpp
# Opt level: O1

Token * __thiscall
EOPlus::Parser_Token_Server<std::_Deque_iterator<EOPlus::Token,_EOPlus::Token_&,_EOPlus::Token_*>_>
::xGetToken(Token *__return_storage_ptr__,
           Parser_Token_Server<std::_Deque_iterator<EOPlus::Token,_EOPlus::Token_&,_EOPlus::Token_*>_>
           *this)

{
  _Elt_pointer pTVar1;
  _Map_pointer ppTVar2;
  Token *pTVar3;
  pointer pcVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  undefined3 uVar12;
  variant local_50;
  
  pTVar1 = (this->it)._M_cur;
  if (pTVar1 == (this->end)._M_cur) {
    util::variant::variant(&local_50);
    __return_storage_ptr__->type = Invalid;
    (__return_storage_ptr__->data).val_int = local_50.val_int;
    *(undefined4 *)&(__return_storage_ptr__->data).field_0x4 = local_50._4_4_;
    *(undefined4 *)&(__return_storage_ptr__->data).val_float = local_50.val_float._0_4_;
    *(undefined4 *)((long)&(__return_storage_ptr__->data).val_float + 4) = local_50.val_float._4_4_;
    (__return_storage_ptr__->data).val_string._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->data).val_string.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&(__return_storage_ptr__->data).val_string,
               local_50.val_string._M_dataplus._M_p,
               local_50.val_string._M_dataplus._M_p + local_50.val_string._M_string_length);
    (__return_storage_ptr__->data).type = local_50.type;
    (__return_storage_ptr__->data).val_bool = local_50.val_bool;
    (__return_storage_ptr__->data).cache_val[0] = local_50.cache_val[0];
    (__return_storage_ptr__->data).cache_val[1] = local_50.cache_val[1];
    (__return_storage_ptr__->data).cache_val[2] = local_50.cache_val[2];
    (__return_storage_ptr__->data).cache_val[3] = local_50.cache_val[3];
    *(undefined3 *)&(__return_storage_ptr__->data).field_0x35 = local_50._53_3_;
    __return_storage_ptr__->newlines = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50.val_string._M_dataplus._M_p != &local_50.val_string.field_2) {
      operator_delete(local_50.val_string._M_dataplus._M_p,
                      local_50.val_string.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    ppTVar2 = (this->it)._M_node;
    (this->it)._M_cur = pTVar1 + 1;
    if (pTVar1 + 1 == (this->it)._M_last) {
      (this->it)._M_node = ppTVar2 + 1;
      pTVar3 = ppTVar2[1];
      (this->it)._M_first = pTVar3;
      (this->it)._M_last = pTVar3 + 6;
      (this->it)._M_cur = pTVar3;
    }
    __return_storage_ptr__->type = pTVar1->type;
    uVar5 = *(undefined4 *)&(pTVar1->data).field_0x4;
    uVar6 = *(undefined4 *)&(pTVar1->data).val_float;
    uVar7 = *(undefined4 *)((long)&(pTVar1->data).val_float + 4);
    (__return_storage_ptr__->data).val_int = (pTVar1->data).val_int;
    *(undefined4 *)&(__return_storage_ptr__->data).field_0x4 = uVar5;
    *(undefined4 *)&(__return_storage_ptr__->data).val_float = uVar6;
    *(undefined4 *)((long)&(__return_storage_ptr__->data).val_float + 4) = uVar7;
    (__return_storage_ptr__->data).val_string._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->data).val_string.field_2;
    pcVar4 = (pTVar1->data).val_string._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&(__return_storage_ptr__->data).val_string,pcVar4,
               pcVar4 + (pTVar1->data).val_string._M_string_length);
    (__return_storage_ptr__->data).type = (pTVar1->data).type;
    bVar8 = (pTVar1->data).cache_val[0];
    bVar9 = (pTVar1->data).cache_val[1];
    bVar10 = (pTVar1->data).cache_val[2];
    bVar11 = (pTVar1->data).cache_val[3];
    uVar12 = *(undefined3 *)&(pTVar1->data).field_0x35;
    (__return_storage_ptr__->data).val_bool = (pTVar1->data).val_bool;
    (__return_storage_ptr__->data).cache_val[0] = bVar8;
    (__return_storage_ptr__->data).cache_val[1] = bVar9;
    (__return_storage_ptr__->data).cache_val[2] = bVar10;
    (__return_storage_ptr__->data).cache_val[3] = bVar11;
    *(undefined3 *)&(__return_storage_ptr__->data).field_0x35 = uVar12;
    __return_storage_ptr__->newlines = pTVar1->newlines;
  }
  return __return_storage_ptr__;
}

Assistant:

Token xGetToken()
			{
				if (it == end)
					return Token();

				return *(it++);
			}